

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall Lodtalk::MethodCompiler::visitSequenceNode(MethodCompiler *this,SequenceNode *node)

{
  pointer ppNVar1;
  bool bVar2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar3;
  Node **child;
  pointer ppNVar4;
  
  pvVar3 = AST::SequenceNode::getChildren(node);
  ppNVar1 = (pvVar3->super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (ppNVar4 = (pvVar3->
                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1
      ) {
    if (!bVar2) {
      MethodAssembler::Assembler::popStackTop(&this->gen);
    }
    (*(*ppNVar4)->_vptr_Node[2])(*ppNVar4,this);
    bVar2 = false;
  }
  return (Oop)&NilObject;
}

Assistant:

Oop MethodCompiler::visitSequenceNode(SequenceNode *node)
{
	bool first = true;
	for(auto &child : node->getChildren())
	{
		if(first)
			first = false;
		else
			gen.popStackTop();

		child->acceptVisitor(this);
	}

	return Oop();
}